

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict declaration_specs(c2m_ctx_t c2m_ctx,int no_err_p,node_t_conflict arg)

{
  parse_ctx *ppVar1;
  token_t ptVar2;
  char *format;
  undefined8 uVar3;
  pos_t pos_00;
  pos_t p;
  node_t_conflict n;
  node_t_conflict pnVar4;
  bool bVar5;
  pos_t spec_pos;
  pos_t pos;
  node_t_conflict pnStack_48;
  int first_p;
  node_t_conflict prev_type_spec;
  node_t_conflict r;
  node_t_conflict list;
  parse_ctx_t parse_ctx;
  node_t_conflict arg_local;
  int no_err_p_local;
  c2m_ctx_t c2m_ctx_local;
  
  ppVar1 = c2m_ctx->parse_ctx;
  pnStack_48 = (node_t_conflict)0x0;
  ptVar2 = ppVar1->curr_token;
  format = (ptVar2->pos).fname;
  uVar3._0_4_ = (ptVar2->pos).lno;
  uVar3._4_4_ = (ptVar2->pos).ln_pos;
  p = ptVar2->pos;
  n = new_node(c2m_ctx,N_LIST);
  bVar5 = arg == (node_t_conflict)0x0;
  do {
    pos_00 = ppVar1->curr_token->pos;
    pnVar4 = pnStack_48;
    if ((short)*(undefined4 *)ppVar1->curr_token == 0x113) {
      prev_type_spec = align_spec(c2m_ctx,no_err_p);
      if (prev_type_spec == &err_struct) {
        return &err_struct;
      }
LAB_001a1d9d:
      pnStack_48 = pnVar4;
      op_append(c2m_ctx,n,prev_type_spec);
    }
    else {
      prev_type_spec = try_f(c2m_ctx,sc_spec);
      if (((prev_type_spec != &err_struct) ||
          (prev_type_spec = try_f(c2m_ctx,type_qual), prev_type_spec != &err_struct)) ||
         (prev_type_spec = try_f(c2m_ctx,func_spec), prev_type_spec != &err_struct))
      goto LAB_001a1d9d;
      if (bVar5) {
        prev_type_spec = type_spec(c2m_ctx,no_err_p,pnStack_48);
        pnVar4 = prev_type_spec;
        if (prev_type_spec == &err_struct) {
          return &err_struct;
        }
        goto LAB_001a1d9d;
      }
      prev_type_spec = try_arg_f(c2m_ctx,type_spec,pnStack_48);
      pnVar4 = prev_type_spec;
      if (prev_type_spec != &err_struct) goto LAB_001a1d9d;
      pnVar4 = try_attr_spec(c2m_ctx,pos_00,(node_t_conflict *)0x0);
      if ((pnVar4 == &err_struct) || (pnVar4 == (node_t_conflict)0x0)) {
        if ((pnStack_48 == (node_t_conflict)0x0) && (arg != (node_t_conflict)0x0)) {
          if (c2m_ctx->options->pedantic_p != 0) {
            warning(c2m_ctx,0x1d634c,format,uVar3);
          }
          pnVar4 = new_pos_node(c2m_ctx,N_INT,p);
          op_append(c2m_ctx,n,pnVar4);
        }
        return n;
      }
    }
    bVar5 = false;
  } while( true );
}

Assistant:

DA (declaration_specs) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t list, r, prev_type_spec = NULL;
  int first_p;
  pos_t pos = curr_token->pos, spec_pos;

  list = new_node (c2m_ctx, N_LIST);
  for (first_p = arg == NULL;; first_p = FALSE) {
    spec_pos = curr_token->pos;
    if (C (T_ALIGNAS)) {
      P (align_spec);
    } else if ((r = TRY (sc_spec)) != err_node) {
    } else if ((r = TRY (type_qual)) != err_node) {
    } else if ((r = TRY (func_spec)) != err_node) {
    } else if (first_p) {
      PA (type_spec, prev_type_spec);
      prev_type_spec = r;
    } else if ((r = TRY_A (type_spec, prev_type_spec)) != err_node) {
      prev_type_spec = r;
    } else if ((r = try_attr_spec (c2m_ctx, spec_pos, FALSE)) != err_node && r != NULL) {
      continue; /* ignore attrs for declaration specs (type attrs) */
    } else
      break;
    op_append (c2m_ctx, list, r);
  }
  if (prev_type_spec == NULL && arg != NULL) {
    if (c2m_options->pedantic_p) warning (c2m_ctx, pos, "type defaults to int");
    r = new_pos_node (c2m_ctx, N_INT, pos);
    op_append (c2m_ctx, list, r);
  }
  return list;
}